

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::Clear(SimpleRecurrentLayerParams *this)

{
  if (this->activation_ != (ActivationParams *)0x0) {
    (*(this->activation_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->activation_ = (ActivationParams *)0x0;
  if (this->weightmatrix_ != (WeightParams *)0x0) {
    (*(this->weightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->weightmatrix_ = (WeightParams *)0x0;
  if (this->recursionmatrix_ != (WeightParams *)0x0) {
    (*(this->recursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->recursionmatrix_ = (WeightParams *)0x0;
  if (this->biasvector_ != (WeightParams *)0x0) {
    (*(this->biasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  *(undefined8 *)((long)&this->inputvectorsize_ + 3) = 0;
  *(undefined8 *)((long)&this->outputvectorsize_ + 3) = 0;
  this->biasvector_ = (WeightParams *)0x0;
  this->inputvectorsize_ = 0;
  return;
}

Assistant:

void SimpleRecurrentLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SimpleRecurrentLayerParams)
  if (GetArenaNoVirtual() == NULL && activation_ != NULL) {
    delete activation_;
  }
  activation_ = NULL;
  if (GetArenaNoVirtual() == NULL && weightmatrix_ != NULL) {
    delete weightmatrix_;
  }
  weightmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && recursionmatrix_ != NULL) {
    delete recursionmatrix_;
  }
  recursionmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && biasvector_ != NULL) {
    delete biasvector_;
  }
  biasvector_ = NULL;
  ::memset(&inputvectorsize_, 0, reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&inputvectorsize_) + sizeof(reverseinput_));
}